

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  uint _c;
  int iVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int _h;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  _func_int *p_Var13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  undefined4 *puVar18;
  int iVar19;
  ulong uVar20;
  Mat local_78;
  
  p_Var13 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var13) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var13);
    uVar11 = (long)*(int *)(&this->field_0xf0 + (long)p_Var13) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var13);
    uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
             (long)(int)_c;
    _h = (int)uVar11;
    uVar17 = 1;
    uVar20 = 1;
    if (opt->use_packing_layout == true) {
      uVar17 = (ulong)((uint)((uVar11 & 3) == 0) * 3 + 1);
      uVar20 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var13),
                 *(int *)(&this->field_0xd4 + (long)p_Var13),_h,_c,(Allocator *)0x0);
    iVar16 = (int)uVar17;
    iVar19 = (int)uVar20;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / (long)iVar16
                     ),*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) /
                       iVar19,(ulong)(uint)(iVar19 * iVar16 * 4),iVar19 * iVar16,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Convolution1D_x86;
    p_Var13 = pp_Var2[-3];
    if (iVar19 <= *(int *)(&this->field_0xd0 + (long)p_Var13)) {
      iVar1 = (this->weight_data_packed).w;
      pvVar3 = (this->weight_data_packed).data;
      sVar4 = (this->weight_data_packed).elemsize;
      sVar5 = (this->weight_data_packed).cstep;
      uVar11 = 0;
      do {
        if (iVar16 <= _h) {
          puVar7 = (undefined4 *)(local_78.cstep * local_78.elemsize * uVar11 + (long)local_78.data)
          ;
          uVar12 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var13)) {
              puVar6 = (undefined4 *)
                       ((long)pvVar3 +
                       ((uVar12 & 0xffffffff) / uVar17) * (long)iVar1 * sVar4 +
                       ((uVar11 & 0xffffffff) / uVar20) * sVar5 * sVar4);
              lVar14 = 0;
              puVar18 = puVar7;
              do {
                uVar10 = 0;
                puVar9 = puVar18;
                uVar15 = uVar20;
                puVar8 = puVar18;
                do {
                  do {
                    *puVar6 = *puVar9;
                    puVar6 = puVar6 + 1;
                    uVar15 = uVar15 - 1;
                    puVar9 = (undefined4 *)((long)puVar9 + local_78.cstep * local_78.elemsize);
                  } while (uVar15 != 0);
                  uVar10 = uVar10 + 1;
                  puVar9 = (undefined4 *)((long)puVar8 + (long)local_78.w * local_78.elemsize);
                  uVar15 = uVar20;
                  puVar8 = puVar9;
                } while (uVar10 != uVar17);
                lVar14 = lVar14 + 1;
                p_Var13 = pp_Var2[-3];
                puVar18 = puVar18 + 1;
              } while (lVar14 < *(int *)(&this->field_0xd4 + (long)p_Var13));
            }
            uVar12 = uVar12 + uVar17;
            puVar7 = (undefined4 *)((long)puVar7 + (long)local_78.w * local_78.elemsize * uVar17);
          } while ((long)uVar12 < (long)((long)_h - (ulong)(iVar16 - 1)));
        }
        uVar11 = uVar11 + uVar20;
      } while ((long)((iVar19 - 1) + uVar11) < (long)*(int *)(&this->field_0xd0 + (long)p_Var13));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}